

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

bool __thiscall
llama_model_loader::load_all_data
          (llama_model_loader *this,ggml_context *ctx,llama_buf_map *bufs,llama_mlocks *lmlocks,
          llama_progress_callback progress_callback,void *progress_callback_user_data)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer ppVar4;
  ulong uVar5;
  llama_mmap *this_00;
  size_type sVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  pointer pfVar9;
  bool bVar10;
  char cVar11;
  size_type sVar12;
  mapped_type *ppgVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined4 *puVar20;
  char *pcVar21;
  llama_tensor_weight *plVar22;
  _func_int **__new_size;
  void *pvVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  _Result<std::pair<ggml_tensor_*,_bool>_> *p_Var25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  size_t last;
  runtime_error *prVar27;
  future<std::pair<ggml_tensor_*,_bool>_> *future;
  undefined8 *puVar28;
  pointer this_01;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  mapped_type pgVar32;
  _State_baseV2 *__tmp_1;
  pointer puVar33;
  long lVar34;
  ulong uVar35;
  undefined8 *puVar36;
  _State_baseV2 *__tmp;
  size_t sVar37;
  _func_int **pp_Var38;
  bool bVar39;
  pair<ggml_tensor_*,_bool> pVar40;
  ggml_backend_dev_props props;
  ggml_backend_buffer *buf;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> events;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> read_buf;
  vector<void_*,_std::allocator<void_*>_> host_ptrs;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> host_buffers;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  validation_result;
  long *local_160;
  string local_158;
  char local_134;
  char local_133;
  char local_131;
  long local_130;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_128;
  ggml_backend_buffer *local_120 [2];
  __basic_future<std::pair<ggml_tensor_*,_bool>_> local_110;
  ggml_context *local_100;
  _func_int **local_f8;
  llama_progress_callback local_f0;
  undefined8 *local_e8;
  undefined8 *puStack_e0;
  long local_d8;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> local_c8;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  long local_78;
  llama_mlocks *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  mapped_type local_58;
  void *local_50;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  local_48;
  
  local_128 = &bufs->_M_h;
  local_f0 = progress_callback;
  local_68 = lmlocks;
  local_50 = progress_callback_user_data;
  if (this->size_data == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x37a,"GGML_ASSERT(%s) failed","size_data != 0 && \"call init_mappings() first\"");
  }
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 0;
  local_c8.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (future<std::pair<ggml_tensor_*,_bool>_> *)0x0;
  local_48.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (future<std::pair<ggml_tensor_*,_bool>_> *)0x0;
  local_78 = 0;
  local_88 = (undefined8 *)0x0;
  puStack_80 = (undefined8 *)0x0;
  local_d8 = 0;
  local_e8 = (undefined8 *)0x0;
  puStack_e0 = (undefined8 *)0x0;
  local_98 = 0;
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_100 = ctx;
  if (this->use_mmap == false) {
    if (this->check_tensors == false) {
      local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffff00000000;
      sVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&bufs->_M_h,(key_type_conflict *)&local_158);
      if (sVar12 == 0) {
        pgVar32 = (mapped_type)0x0;
      }
      else {
        local_120[0] = (ggml_backend_buffer *)((ulong)local_120[0] & 0xffffffff00000000);
        ppgVar13 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_128,(key_type *)local_120);
        pgVar32 = *ppgVar13;
      }
      if (pgVar32 == (mapped_type)0x0) {
        llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: no buffer found for async uploads\n",
                           "load_all_data");
      }
      else {
        lVar14 = ggml_backend_buffer_get_type();
        lVar15 = ggml_backend_buft_get_device(lVar14);
        if (lVar15 == 0) {
          ggml_backend_buft_name(lVar14);
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: no device found for buffer type %s for async uploads\n",
                             "load_all_data");
        }
        else {
          lVar16 = ggml_backend_dev_buffer_type(lVar15);
          if (lVar14 == lVar16) {
            ggml_backend_dev_get_props(lVar15,&local_158);
            if (((local_134 == '\x01') && (local_133 == '\x01')) && (local_131 != '\0')) {
              lVar16 = ggml_backend_dev_host_buffer_type(lVar15);
              if (lVar16 == 0) {
                ggml_backend_dev_name(lVar15);
                pcVar21 = "%s: no host buffer type found for device %s\n";
              }
              else {
                lVar34 = 4;
                lVar14 = 0;
                do {
                  local_120[0] = (ggml_backend_buffer *)
                                 ggml_backend_buft_alloc_buffer(lVar16,0x100000);
                  ctx = local_100;
                  if (local_120[0] == (ggml_backend_buffer *)0x0) {
                    ggml_backend_dev_name(lVar15);
                    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                       "%s: failed to allocate host buffer for async uploads for device %s\n"
                                       ,"load_all_data");
                    goto LAB_001b6cac;
                  }
                  std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
                  emplace_back<ggml_backend_buffer*&>
                            ((vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                             &local_88,local_120);
                  local_110._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)ggml_backend_buffer_get_base(local_120[0]);
                  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                            ((vector<void*,std::allocator<void*>> *)&local_a8,(void **)&local_110);
                  local_110._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)ggml_backend_event_new(lVar15);
                  if (local_110._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr == (element_type *)0x0) {
                    ggml_backend_dev_name(lVar15);
                    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                       "%s: failed to create event for async uploads for device %s\n"
                                       ,"load_all_data");
                    ctx = local_100;
                    goto LAB_001b6caf;
                  }
                  std::vector<ggml_backend_event*,std::allocator<ggml_backend_event*>>::
                  emplace_back<ggml_backend_event*&>
                            ((vector<ggml_backend_event*,std::allocator<ggml_backend_event*>> *)
                             &local_e8,(ggml_backend_event **)&local_110);
                  lVar34 = lVar34 + -1;
                } while (lVar34 != 0);
                lVar14 = ggml_backend_dev_init(lVar15);
                ctx = local_100;
                if (lVar14 != 0) goto LAB_001b6caf;
                ggml_backend_dev_name(lVar15);
                pcVar21 = "%s: failed to initialize backend for device %s for async uploads\n";
              }
            }
            else {
              ggml_backend_dev_name(lVar15);
              pcVar21 = "%s: device %s does not support async, host buffers or events\n";
            }
            lVar14 = 0;
            llama_log_internal(GGML_LOG_LEVEL_DEBUG,pcVar21,"load_all_data");
            goto LAB_001b6caf;
          }
          uVar17 = ggml_backend_buft_name(lVar14);
          uVar18 = ggml_backend_dev_name(lVar15);
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: buffer type %s is not the default buffer type for device %s for async uploads\n"
                             ,"load_all_data",uVar17,uVar18);
        }
      }
    }
LAB_001b6cac:
    lVar14 = 0;
  }
LAB_001b6caf:
  local_130 = lVar14;
  if (lVar14 != 0) {
    uVar17 = ggml_backend_get_device(lVar14);
    uVar17 = ggml_backend_dev_name(uVar17);
    local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffff00000000;
    ppgVar13 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)local_128,(key_type *)&local_158);
    uVar18 = ggml_backend_buffer_get_type(*ppgVar13);
    uVar18 = ggml_backend_buft_name(uVar18);
    uVar19 = ggml_backend_name(local_130);
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                       "%s: using async uploads for device %s, buffer type %s, backend %s\n",
                       "load_all_data",uVar17,uVar18,uVar19);
  }
  puVar20 = (undefined4 *)ggml_get_first_tensor(ctx);
  uVar35 = 0;
  do {
    puVar7 = puStack_e0;
    puVar36 = local_e8;
    if (puVar20 == (undefined4 *)0x0) {
      for (; puVar8 = puStack_80, puVar28 = local_88, puVar36 != puVar7; puVar36 = puVar36 + 1) {
        uVar17 = *puVar36;
        ggml_backend_event_synchronize(uVar17);
        ggml_backend_event_free(uVar17);
      }
      for (; puVar28 != puVar8; puVar28 = puVar28 + 1) {
        ggml_backend_buffer_free(*puVar28);
      }
      ggml_backend_free(local_130);
      pfVar9 = local_48.
               super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_48.
          super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar39 = false;
        this_01 = local_48.
                  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pVar40 = std::future<std::pair<ggml_tensor_*,_bool>_>::get(this_01);
          if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            uVar17 = ggml_get_name(pVar40.first);
            bVar39 = true;
            llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: tensor \'%s\' has invalid data\n",
                               "load_all_data",uVar17);
          }
          this_01 = this_01 + 1;
        } while (this_01 != pfVar9);
        if (bVar39) {
          prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar27,"found tensors with invalid data");
          __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      bVar39 = true;
      if (this->size_data <= this->size_done) {
        if ((this->use_mmap == true) &&
           (puVar33 = (this->mappings).
                      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           (this->mappings).
           super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish != puVar33)) {
          uVar29 = 1;
          uVar35 = 0;
          do {
            ppVar4 = (this->mmaps_used).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->mmaps_used).
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4) <=
                uVar35) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar35);
            }
            llama_mmap::unmap_fragment
                      (puVar33[uVar35]._M_t.
                       super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                       super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                       super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl,0,
                       ppVar4[uVar35].first);
            sVar37 = ppVar4[uVar35].second;
            if (sVar37 != 0) {
              this_00 = puVar33[uVar35]._M_t.
                        super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                        super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                        super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl;
              last = llama_mmap::size(this_00);
              llama_mmap::unmap_fragment(this_00,sVar37,last);
            }
            uVar35 = (ulong)uVar29;
            puVar33 = (this->mappings).
                      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar29 = uVar29 + 1;
          } while (uVar35 < (ulong)((long)(this->mappings).
                                          super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar33
                                   >> 3));
        }
        if (local_f0 != (llama_progress_callback)0x0) {
          bVar39 = (*local_f0)(1.0,local_50);
        }
      }
LAB_001b76c2:
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      if (local_e8 != (undefined8 *)0x0) {
        operator_delete(local_e8,local_d8 - (long)local_e8);
      }
      if (local_88 != (undefined8 *)0x0) {
        operator_delete(local_88,local_78 - (long)local_88);
      }
      std::
      vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
      ::~vector(&local_48);
      if (local_c8.
          super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return bVar39;
    }
    pcVar21 = (char *)ggml_get_name(puVar20);
    plVar22 = get_weight(this,pcVar21);
    if (plVar22 == (llama_tensor_weight *)0x0) {
      bVar39 = false;
    }
    else {
      if (local_f0 != (llama_progress_callback)0x0) {
        bVar10 = (*local_f0)((float)this->size_done / (float)this->size_data,local_50);
        bVar39 = true;
        if (!bVar10) goto LAB_001b750e;
      }
      __new_size = (_func_int **)ggml_nbytes(puVar20);
      uVar30 = (ulong)plVar22->idx;
      if (this->use_mmap == true) {
        puVar33 = (this->mappings).
                  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->mappings).
                          super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar33 >> 3) <= uVar30
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar30);
        }
        local_158._M_dataplus._M_p._0_4_ = (uint)plVar22->idx;
        sVar12 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(local_128,(key_type_conflict *)&local_158);
        if (sVar12 == 0) {
          pgVar32 = (mapped_type)0x0;
        }
        else {
          local_158._M_dataplus._M_p._0_4_ = (uint)plVar22->idx;
          ppgVar13 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_128,(key_type *)&local_158);
          pgVar32 = *ppgVar13;
        }
        pvVar23 = llama_mmap::addr((llama_mmap *)
                                   puVar33[uVar30]._M_t.
                                   super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>
                                   ._M_t);
        pp_Var38 = (_func_int **)((long)pvVar23 + plVar22->offs);
        if (this->check_tensors == true) {
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          local_f8 = pp_Var38;
          local_58 = pgVar32;
          p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var24->_M_use_count = 1;
          p_Var24->_M_weak_count = 1;
          p_Var24->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00286d50;
          local_60 = p_Var24 + 1;
          p_Var24[2]._M_use_count = 0;
          p_Var24[1]._M_use_count = 0;
          p_Var24[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var24[1]._M_weak_count + 1) = 0;
          p_Var24[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var24[3]._M_use_count = 0;
          p_Var24[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00286da0;
          p_Var25 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
          std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var25);
          p_Var24[4]._vptr__Sp_counted_base = (_func_int **)p_Var25;
          *(undefined4 **)&p_Var24[4]._M_use_count = puVar20;
          p_Var24[5]._vptr__Sp_counted_base = local_f8;
          *(_func_int ***)&p_Var24[5]._M_use_count = __new_size;
          local_120[0] = (ggml_backend_buffer *)0x0;
          local_160 = (long *)operator_new(0x20);
          p_Var26 = local_60;
          *local_160 = (long)&PTR___State_00286df8;
          local_160[1] = (long)local_60;
          local_160[2] = (long)std::__future_base::
                               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>
                               ::_M_run;
          local_160[3] = 0;
          std::thread::_M_start_thread(local_120,&local_160,0);
          if (local_160 != (long *)0x0) {
            (**(code **)(*local_160 + 8))();
          }
          sVar6 = local_158._M_string_length;
          if (p_Var24[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_001b7927:
            std::terminate();
          }
          p_Var24[3]._vptr__Sp_counted_base = (_func_int **)local_120[0];
          local_158._M_dataplus._M_p = (pointer)p_Var26;
          bVar39 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_158._M_string_length = (size_type)p_Var24;
          if (bVar39) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6);
          }
          pgVar32 = local_58;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_dataplus._M_p ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
            p_Var26->_M_use_count = 1;
            p_Var26->_M_weak_count = 1;
            p_Var26->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00286e38;
            p_Var26[2]._M_use_count = 0;
            p_Var26[1]._M_use_count = 0;
            p_Var26[1]._M_weak_count = 0;
            *(undefined8 *)((long)&p_Var26[1]._M_weak_count + 1) = 0;
            p_Var26[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00286e88;
            p_Var25 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
            std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var25);
            pgVar32 = local_58;
            sVar6 = local_158._M_string_length;
            p_Var26[3]._vptr__Sp_counted_base = (_func_int **)p_Var25;
            *(undefined4 **)&p_Var26[3]._M_use_count = puVar20;
            p_Var26[4]._vptr__Sp_counted_base = local_f8;
            *(_func_int ***)&p_Var26[4]._M_use_count = __new_size;
            bVar39 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_158._M_dataplus._M_p = (pointer)(p_Var26 + 1);
            local_158._M_string_length = (size_type)p_Var26;
            if (bVar39) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6);
            }
          }
          std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                    (&local_110,(__state_type *)&local_158);
          pp_Var38 = local_f8;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          }
          std::
          vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
          ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                    ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                      *)&local_48,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_110);
          if (local_110._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if (pgVar32 == (mapped_type)0x0) {
          if (*(long *)(puVar20 + 0x3e) == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                       ,0x3f5,"GGML_ASSERT(%s) failed","buf_mmap || cur->data");
          }
        }
        else if (*(long *)(puVar20 + 0x3e) == 0) {
          ggml_backend_tensor_alloc(pgVar32,puVar20,pp_Var38);
          if (local_68 != (llama_mlocks *)0x0) {
            puVar3 = (local_68->
                     super__Vector_base<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(local_68->
                              super__Vector_base<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
                (ulong)plVar22->idx) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            llama_mlock::grow_to
                      ((llama_mlock *)
                       puVar3[plVar22->idx]._M_t.
                       super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t,
                       plVar22->offs + (long)__new_size);
          }
          uVar1 = plVar22->idx;
          ppVar4 = (this->mmaps_used).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = plVar22->offs;
          uVar5 = ppVar4[uVar1].second;
          uVar31 = ppVar4[uVar1].first;
          if (uVar30 < ppVar4[uVar1].first) {
            uVar31 = uVar30;
          }
          ppVar4[uVar1].first = uVar31;
          uVar31 = (long)__new_size + uVar30;
          if ((long)__new_size + uVar30 < uVar5) {
            uVar31 = uVar5;
          }
          ppVar4[uVar1].second = uVar31;
          goto LAB_001b74fb;
        }
        ggml_backend_tensor_set(puVar20,pp_Var38,0);
      }
      else {
        puVar2 = (this->files).
                 super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->files).
                          super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar30)
        {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar30);
        }
        cVar11 = ggml_backend_buffer_is_host(*(undefined8 *)(puVar20 + 2));
        if (cVar11 == '\0') {
          if (local_130 == 0) {
            std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::resize
                      (&local_c8,(size_type)__new_size);
            llama_file::seek((llama_file *)
                             puVar2[uVar30]._M_t.
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t,plVar22->offs,0);
            llama_file::read_raw
                      ((llama_file *)
                       puVar2[uVar30]._M_t.
                       super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                       local_c8.
                       super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(size_t)__new_size);
            ggml_backend_tensor_set
                      (puVar20,local_c8.
                               super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,0);
            if ((this->check_tensors == true) &&
               (cVar11 = ggml_validate_row_data
                                   (*puVar20,local_c8.
                                             super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,__new_size),
               cVar11 == '\0')) {
              prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
              uVar17 = ggml_get_name(puVar20);
              format_abi_cxx11_(&local_158,"tensor \'%s\' has invalid data",uVar17);
              std::runtime_error::runtime_error(prVar27,(string *)&local_158);
              __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            llama_file::seek((llama_file *)
                             puVar2[uVar30]._M_t.
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t,plVar22->offs,0);
            if (__new_size != (_func_int **)0x0) {
              pp_Var38 = (_func_int **)0x0;
              do {
                sVar37 = (long)__new_size - (long)pp_Var38;
                if (0xfffff < sVar37) {
                  sVar37 = 0x100000;
                }
                ggml_backend_event_synchronize(local_e8[uVar35]);
                llama_file::read_raw
                          ((llama_file *)
                           puVar2[uVar30]._M_t.
                           super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                           *(void **)((long)local_a8 + uVar35 * 8),sVar37);
                ggml_backend_tensor_set_async
                          (local_130,puVar20,*(undefined8 *)((long)local_a8 + uVar35 * 8),pp_Var38,
                           sVar37);
                ggml_backend_event_record(local_e8[uVar35],local_130);
                pp_Var38 = (_func_int **)((long)pp_Var38 + sVar37);
                uVar35 = (ulong)((int)uVar35 + 1U & 3);
              } while (pp_Var38 < __new_size);
            }
          }
        }
        else {
          llama_file::seek((llama_file *)
                           puVar2[uVar30]._M_t.
                           super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                           plVar22->offs,0);
          llama_file::read_raw
                    ((llama_file *)
                     puVar2[uVar30]._M_t.
                     super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                     *(void **)(puVar20 + 0x3e),(size_t)__new_size);
          if (this->check_tensors == true) {
            local_158._M_dataplus._M_p = (pointer)0x0;
            local_158._M_string_length = 0;
            p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
            p_Var24->_M_use_count = 1;
            p_Var24->_M_weak_count = 1;
            p_Var24->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00286ed0;
            p_Var26 = p_Var24 + 1;
            p_Var24[2]._M_use_count = 0;
            p_Var24[1]._M_use_count = 0;
            p_Var24[1]._M_weak_count = 0;
            *(undefined8 *)((long)&p_Var24[1]._M_weak_count + 1) = 0;
            p_Var24[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var24[3]._M_use_count = 0;
            p_Var24[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00286f20;
            p_Var25 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
            std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var25);
            p_Var24[4]._vptr__Sp_counted_base = (_func_int **)p_Var25;
            *(undefined4 **)&p_Var24[4]._M_use_count = puVar20;
            p_Var24[5]._vptr__Sp_counted_base = __new_size;
            local_120[0] = (ggml_backend_buffer *)0x0;
            local_160 = (long *)operator_new(0x20);
            *local_160 = (long)&PTR___State_00286f78;
            local_160[1] = (long)p_Var26;
            local_160[2] = (long)std::__future_base::
                                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>
                                 ::_M_run;
            local_160[3] = 0;
            std::thread::_M_start_thread(local_120,&local_160,0);
            if (local_160 != (long *)0x0) {
              (**(code **)(*local_160 + 8))();
            }
            sVar6 = local_158._M_string_length;
            if (p_Var24[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_001b7927;
            p_Var24[3]._vptr__Sp_counted_base = (_func_int **)local_120[0];
            bVar39 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_158._M_dataplus._M_p = (pointer)p_Var26;
            local_158._M_string_length = (size_type)p_Var24;
            if (bVar39) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_dataplus._M_p ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
              p_Var26->_M_use_count = 1;
              p_Var26->_M_weak_count = 1;
              p_Var26->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00286fb8
              ;
              p_Var26[2]._M_use_count = 0;
              p_Var26[1]._M_use_count = 0;
              p_Var26[1]._M_weak_count = 0;
              *(undefined8 *)((long)&p_Var26[1]._M_weak_count + 1) = 0;
              p_Var26[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00287008;
              p_Var25 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
              std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var25);
              sVar6 = local_158._M_string_length;
              p_Var26[3]._vptr__Sp_counted_base = (_func_int **)p_Var25;
              *(undefined4 **)&p_Var26[3]._M_use_count = puVar20;
              p_Var26[4]._vptr__Sp_counted_base = __new_size;
              bVar39 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_158._M_dataplus._M_p = (pointer)(p_Var26 + 1);
              local_158._M_string_length = (size_type)p_Var26;
              if (bVar39) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6);
              }
            }
            std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                      (&local_110,(__state_type *)&local_158);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length)
              ;
            }
            std::
            vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
            ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                      ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                        *)&local_48,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_110);
            if (local_110._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_110._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
        }
      }
LAB_001b74fb:
      this->size_done = this->size_done + (long)__new_size;
      bVar39 = false;
      ctx = local_100;
    }
LAB_001b750e:
    if (bVar39) {
      bVar39 = false;
      goto LAB_001b76c2;
    }
    puVar20 = (undefined4 *)ggml_get_next_tensor(ctx);
  } while( true );
}

Assistant:

bool llama_model_loader::load_all_data(
        struct ggml_context * ctx,
        llama_buf_map & bufs,
        llama_mlocks * lmlocks,
        llama_progress_callback progress_callback,
        void * progress_callback_user_data) {
    GGML_ASSERT(size_data != 0 && "call init_mappings() first");

    std::vector<no_init<uint8_t>> read_buf;
    std::vector<std::future<std::pair<ggml_tensor *, bool>>> validation_result;

    // 4 staging buffers for async uploads, each sized 1MB seems to be a good default for single NVMe drives.
    // NVMe raid configurations might require more / larger buffers.
    constexpr size_t n_buffers = 4;
    constexpr size_t buffer_size = 1 * 1024 * 1024; // 1MB

    std::vector<ggml_backend_buffer_t> host_buffers;
    std::vector<ggml_backend_event_t> events;
    std::vector<void *> host_ptrs;
    size_t buffer_idx = 0; // buffer to use for async loads
    ggml_backend_t upload_backend = [&](const char * func) -> ggml_backend_t {
        if (use_mmap || check_tensors) {
            return nullptr;
        }
        // When not using mmaped io use async uploads from pinned memory to GPU memory.
        // First determine if the backend supports the necessary features for async uploads.
        auto * buf = bufs.count(0) ? bufs.at(0) : nullptr;
        if (!buf) {
            LLAMA_LOG_DEBUG("%s: no buffer found for async uploads\n", func);
            return nullptr;
        }

        auto * buft = ggml_backend_buffer_get_type(buf);
        auto * dev = ggml_backend_buft_get_device(buft);
        if (!dev) {
            LLAMA_LOG_DEBUG("%s: no device found for buffer type %s for async uploads\n", func,
                ggml_backend_buft_name(buft));
            return nullptr;
        }

        if (buft != ggml_backend_dev_buffer_type(dev)) {
            LLAMA_LOG_DEBUG("%s: buffer type %s is not the default buffer type for device %s for async uploads\n", func,
                ggml_backend_buft_name(buft), ggml_backend_dev_name(dev));
            return nullptr;
        }

        ggml_backend_dev_props props;
        ggml_backend_dev_get_props(dev, &props);
        if (!props.caps.async || !props.caps.host_buffer || !props.caps.events) {
            LLAMA_LOG_DEBUG("%s: device %s does not support async, host buffers or events\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
        if (!host_buft) {
            LLAMA_LOG_DEBUG("%s: no host buffer type found for device %s\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        // If the backend is supported, create pinned memory buffers and events for synchronisation.
        for (size_t idx = 0; idx < n_buffers; ++idx) {
            auto * buf = ggml_backend_buft_alloc_buffer(host_buft, buffer_size);
            if (!buf) {
                LLAMA_LOG_DEBUG("%s: failed to allocate host buffer for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            host_buffers.emplace_back(buf);
            host_ptrs.emplace_back(ggml_backend_buffer_get_base(buf));

            auto * event = ggml_backend_event_new(dev);
            if (!event) {
                LLAMA_LOG_DEBUG("%s: failed to create event for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            events.emplace_back(event);
        }

        ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
        if (!backend) {
            LLAMA_LOG_DEBUG("%s: failed to initialize backend for device %s for async uploads\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        return backend;
    }(__func__);

    if (upload_backend) {
        LLAMA_LOG_DEBUG("%s: using async uploads for device %s, buffer type %s, backend %s\n", __func__,
            ggml_backend_dev_name(ggml_backend_get_device(upload_backend)),
            ggml_backend_buft_name(ggml_backend_buffer_get_type(bufs.at(0))),
            ggml_backend_name(upload_backend));
    }

    for (struct ggml_tensor * cur = ggml_get_first_tensor(ctx); cur != NULL; cur = ggml_get_next_tensor(ctx, cur)) {
        const auto * weight = get_weight(ggml_get_name(cur));
        if (weight == nullptr) {
            // this can happen with split experts models
            continue;
        }

        if (progress_callback) {
            if (!progress_callback((float) size_done / size_data, progress_callback_user_data)) {
                return false;
            }
        }

        size_t n_size = ggml_nbytes(cur);

        if (use_mmap) {
            const auto & mapping = mappings.at(weight->idx);
            ggml_backend_buffer_t buf_mmap = nullptr;
            if (bufs.count(weight->idx)) {
                buf_mmap = bufs.at(weight->idx);
            }
            uint8_t * data = (uint8_t *) mapping->addr() + weight->offs;

            if (check_tensors) {
                validation_result.emplace_back(std::async(std::launch::async, [cur, data, n_size] {
                    return std::make_pair(cur, ggml_validate_row_data(cur->type, data, n_size));
                }));
            }

            GGML_ASSERT(buf_mmap || cur->data); // either we have a buffer to allocate the tensor in, or it is already allocated
            if (buf_mmap && cur->data == nullptr) {
                ggml_backend_tensor_alloc(buf_mmap, cur, data);
                if (lmlocks) {
                    const auto & lmlock = lmlocks->at(weight->idx);
                    lmlock->grow_to(weight->offs + n_size);
                }

                auto & mmap_used = mmaps_used[weight->idx];
                mmap_used.first  = std::min(mmap_used.first,  weight->offs);
                mmap_used.second = std::max(mmap_used.second, weight->offs + n_size);
            } else {
                ggml_backend_tensor_set(cur, data, 0, n_size);
            }
        } else {
            const auto & file = files.at(weight->idx);
            if (ggml_backend_buffer_is_host(cur->buffer)) {
                file->seek(weight->offs, SEEK_SET);
                file->read_raw(cur->data, n_size);
                if (check_tensors) {
                    validation_result.emplace_back(std::async(std::launch::async, [cur, n_size] {
                        return std::make_pair(cur, ggml_validate_row_data(cur->type, cur->data, n_size));
                    }));
                }
            } else {
                // If upload_backend is valid load the tensor in chunks to pinned memory and upload the buffers asynchronously to the GPU.
                if (upload_backend) {
                    file->seek(weight->offs, SEEK_SET);

                    size_t bytes_read = 0;

                    while (bytes_read < n_size) {
                        size_t read_iteration = std::min<size_t>(buffer_size, n_size - bytes_read);

                        ggml_backend_event_synchronize(events[buffer_idx]);
                        file->read_raw(host_ptrs[buffer_idx], read_iteration);
                        ggml_backend_tensor_set_async(upload_backend, cur, host_ptrs[buffer_idx], bytes_read, read_iteration);
                        ggml_backend_event_record(events[buffer_idx], upload_backend);

                        bytes_read += read_iteration;
                        ++buffer_idx;
                        buffer_idx %= n_buffers;
                    }
                } else {
                    read_buf.resize(n_size);
                    file->seek(weight->offs, SEEK_SET);
                    file->read_raw(read_buf.data(), n_size);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, n_size);
                    if (check_tensors && !ggml_validate_row_data(cur->type, read_buf.data(), n_size)) {
                        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
                    }
                }
            }
        }

        size_done += n_size;
    }

    // free temporary resources used for async uploads
    for (auto * event : events) {
        ggml_backend_event_synchronize(event);
        ggml_backend_event_free(event);
    }
    for (auto * buf : host_buffers) {
        ggml_backend_buffer_free(buf);
    }
    ggml_backend_free(upload_backend);

    // check validation results
    bool validation_failed = false;
    for (auto & future : validation_result) {
        auto result = future.get();
        if (!result.second) {
            LLAMA_LOG_ERROR("%s: tensor '%s' has invalid data\n", __func__, ggml_get_name(result.first));
            validation_failed = true;
        }
    }
    if (validation_failed) {
        throw std::runtime_error("found tensors with invalid data");
    }

    // check if this is the last call and do final cleanup
    if (size_done >= size_data) {
        // unmap offloaded tensors and metadata
        if (use_mmap) {
            for (uint32_t idx = 0; idx < mappings.size(); idx++) {
                const auto & mmap_used = mmaps_used.at(idx);
                auto & mapping = mappings.at(idx);
                mapping->unmap_fragment(0, mmap_used.first);
                if (mmap_used.second != 0) {
                    mapping->unmap_fragment(mmap_used.second, mapping->size());
                }
            }
        }
        if (progress_callback) {
            // Even though the model is done loading, we still honor
            // cancellation since we need to free allocations.
            return progress_callback(1.0f, progress_callback_user_data);
        }
    }

    return true;
}